

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

int assert_true(int a,char *testcase,int line)

{
  test_counter = test_counter + 1;
  if (a == 0) {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
    printf("# Failure on line %d\n",(ulong)(uint)line);
    global_err = global_err + 1;
  }
  else {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,testcase);
  }
  return (uint)(a == 0);
}

Assistant:

int assert_true(int a, const char *testcase, int line)
{
    test_counter++;
    int err = !a;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Failure on line %d\n", line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}